

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# re2.cc
# Opt level: O3

map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
* __thiscall re2::RE2::CapturingGroupNames_abi_cxx11_(RE2 *this)

{
  int iVar1;
  undefined8 uVar2;
  long *in_FS_OFFSET;
  anon_class_8_1_ba1d2be6 __callable;
  RE2 *local_28;
  undefined1 *local_20;
  
  local_20 = (undefined1 *)&local_28;
  *in_FS_OFFSET = (long)&local_20;
  *in_FS_OFFSET =
       (long)std::once_flag::_Prepare_execution::
             _Prepare_execution<(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/mutex:775:25)>
             ::anon_class_1_0_00000001::__invoke;
  local_28 = this;
  iVar1 = pthread_once(&(this->group_names_once_)._M_once,__once_proxy);
  if (iVar1 == 0) {
    *in_FS_OFFSET = 0;
    *in_FS_OFFSET = 0;
    return this->group_names_;
  }
  uVar2 = std::__throw_system_error(iVar1);
  *in_FS_OFFSET = 0;
  *in_FS_OFFSET = 0;
  _Unwind_Resume(uVar2);
}

Assistant:

const map<int, string>& RE2::CapturingGroupNames() const {
  std::call_once(group_names_once_, [this]() {
    if (suffix_regexp_ != NULL)
      group_names_ = suffix_regexp_->CaptureNames();
    if (group_names_ == NULL)
      group_names_ = empty_group_names;
  });
  return *group_names_;
}